

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peter.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    switch(key) {
    case 0x44:
      glfwSetInputMode(window,0x33001,0x34003);
      printf("(( cursor is disabled ))\n");
      break;
    case 0x48:
      glfwSetInputMode(window,0x33001,0x34002);
      printf("(( cursor is hidden ))\n");
      break;
    case 0x4e:
      glfwSetInputMode(window,0x33001,0x34001);
      printf("(( cursor is normal ))\n");
      break;
    case 0x52:
      reopen = '\x01';
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_D:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
            printf("(( cursor is disabled ))\n");
            break;

        case GLFW_KEY_H:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
            printf("(( cursor is hidden ))\n");
            break;

        case GLFW_KEY_N:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
            printf("(( cursor is normal ))\n");
            break;

        case GLFW_KEY_R:
            reopen = GL_TRUE;
            break;
    }
}